

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Vec3f __thiscall TRM::Model::normal(Model *this,Vec2f uvf)

{
  float fVar1;
  byte bVar2;
  Vec3f VVar3;
  int iVar4;
  TGAColor TVar5;
  float *pfVar6;
  int *piVar7;
  byte *pbVar8;
  TGAImage *this_00;
  int local_3c;
  uchar auStack_35 [4];
  int i;
  TGAColor c;
  Vec2i uv;
  Model *this_local;
  Vec2f uvf_local;
  Vec3f res;
  
  unique0x10000124 = uvf;
  pfVar6 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                     ((vec<2,_float,_(glm::qualifier)0> *)((long)&this_local + 4),0);
  fVar1 = *pfVar6;
  this_00 = &this->normalmap_;
  iVar4 = TGAImage::get_width(this_00);
  piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                     ((vec<2,_int,_(glm::qualifier)0> *)&stack0xffffffffffffffd0,0);
  *piVar7 = (int)(fVar1 * (float)iVar4);
  pfVar6 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                     ((vec<2,_float,_(glm::qualifier)0> *)((long)&this_local + 4),1);
  fVar1 = *pfVar6;
  iVar4 = TGAImage::get_height(this_00);
  piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                     ((vec<2,_int,_(glm::qualifier)0> *)&stack0xffffffffffffffd0,1);
  *piVar7 = (int)(fVar1 * (float)iVar4);
  piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                     ((vec<2,_int,_(glm::qualifier)0> *)&stack0xffffffffffffffd0,0);
  iVar4 = *piVar7;
  piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                     ((vec<2,_int,_(glm::qualifier)0> *)&stack0xffffffffffffffd0,1);
  TVar5 = TGAImage::get(this_00,iVar4,*piVar7);
  auStack_35 = TVar5.bgra;
  i._3_1_ = TVar5.bytespp;
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    pbVar8 = TGAColor::operator[]((TGAColor *)&stack0xffffffffffffffcb,local_3c);
    bVar2 = *pbVar8;
    pfVar6 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&uvf_local,2 - local_3c);
    *pfVar6 = (float)bVar2 / 255.0 + (float)bVar2 / 255.0 + -1.0;
  }
  VVar3.field_2.z = res.field_0.x;
  VVar3.field_0.x = uvf_local.field_0.x;
  VVar3.field_1.y = uvf_local.field_1.y;
  return VVar3;
}

Assistant:

Vec3f Model::normal(Vec2f uvf) {
  Vec2i uv;
  uv[0] = uvf[0] * normalmap_.get_width();
  uv[1] = uvf[1] * normalmap_.get_height();
  TGAColor c = normalmap_.get(uv[0], uv[1]);
  Vec3f res;
  for (int i = 0; i < 3; i++) res[2 - i] = (float)c[i] / 255.f * 2.f - 1.f;
  return res;
}